

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O1

USTATUS __thiscall FfsParser::parseVersionSectionBody(FfsParser *this,UModelIndex *index)

{
  TreeModel *this_00;
  USTATUS UVar1;
  CBString local_80;
  CBString local_68;
  CBString local_50;
  UByteArray local_38;
  
  UVar1 = 1;
  if (((-1 < index->r) && (-1 < index->c)) && (index->m != (TreeModel *)0x0)) {
    this_00 = this->model;
    Bstrlib::CBString::CBString(&local_68,"\nVersion string: ");
    TreeModel::body(&local_38,this->model,index);
    uFromUcs2(&local_80,local_38.d._M_dataplus._M_p,0);
    Bstrlib::CBString::operator+(&local_50,&local_68,&local_80);
    TreeModel::addInfo(this_00,index,&local_50,true);
    Bstrlib::CBString::~CBString(&local_50);
    Bstrlib::CBString::~CBString(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38.d._M_dataplus._M_p != &local_38.d.field_2) {
      operator_delete(local_38.d._M_dataplus._M_p);
    }
    Bstrlib::CBString::~CBString(&local_68);
    UVar1 = 0;
  }
  return UVar1;
}

Assistant:

std::vector<std::pair<std::vector<UString>, UModelIndex> > FfsParser::getFitTable() const
{
    return fitParser->getFitTable();
}